

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTrivial(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  ulong extraout_RDX;
  Type type_00;
  
  if (type.id < 2) {
    if ((type.id & 1) != 0) {
      ::wasm::HeapType::getSignature();
      if (extraout_RDX < 2) {
        pEVar2 = (Expression *)0x0;
      }
      else {
        ::wasm::HeapType::getSignature();
        pEVar2 = makeTrivial(this,type_00);
      }
      pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
      pEVar3->_id = ReturnId;
      (pEVar3->type).id = 0;
      *(undefined8 *)(pEVar3 + 1) = 0;
      (pEVar3->type).id = 1;
      *(Expression **)(pEVar3 + 1) = pEVar2;
      return pEVar3;
    }
    pEVar2 = makeNop(this,type);
    return pEVar2;
  }
  uVar1 = Random::upTo(&this->random,2);
  if ((uVar1 == 0) && (this->funcContext != (FunctionCreationContext *)0x0)) {
    pEVar2 = makeLocalGet(this,type);
    return pEVar2;
  }
  pEVar2 = makeConst(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTrivial(Type type) {
  if (type.isConcrete()) {
    if (oneIn(2) && funcContext) {
      return makeLocalGet(type);
    } else {
      return makeConst(type);
    }
  } else if (type == Type::none) {
    return makeNop(type);
  }
  assert(type == Type::unreachable);
  Expression* ret = nullptr;
  if (funcContext->func->getResults().isConcrete()) {
    ret = makeTrivial(funcContext->func->getResults());
  }
  return builder.makeReturn(ret);
}